

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disabled_tests_decl.cpp
# Opt level: O2

void __thiscall
iu_TypedFoo_x_iutest_x_DISABLED_Bar_Test<int>::Body
          (iu_TypedFoo_x_iutest_x_DISABLED_Bar_Test<int> *this)

{
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  memset(&local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/disabled_tests_decl.cpp"
             ,0x70,"Failed.\n");
  local_1c0._44_4_ = 2;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
  return;
}

Assistant:

IUTEST_TYPED_TEST(TypedFoo, DISABLED_Bar)
{
    IUTEST_FAIL();
}